

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::addUnprocessedClause(SaturationAlgorithm *this,Clause *cl)

{
  bool bVar1;
  Clause *this_00;
  long in_RDI;
  Clause *in_stack_00000070;
  SaturationAlgorithm *in_stack_00000078;
  
  *(int *)(in_RDI + 0x148) = *(int *)(in_RDI + 0x148) + 1;
  *(int *)(DAT_01333840 + 0x1d4) = *(int *)(DAT_01333840 + 0x1d4) + 1;
  this_00 = doImmediateSimplification(in_stack_00000078,in_stack_00000070);
  if (this_00 != (Clause *)0x0) {
    bVar1 = Kernel::Clause::isEmpty(this_00);
    if (bVar1) {
      handleEmptyClause(this,cl);
    }
    else {
      Kernel::Clause::setStore(this_00,(Store)((ulong)in_RDI >> 0x20));
      (**(code **)(**(long **)(in_RDI + 0x70) + 0x10))(*(long **)(in_RDI + 0x70),this_00);
    }
  }
  return;
}

Assistant:

void SaturationAlgorithm::addUnprocessedClause(Clause* cl)
{
  _generatedClauseCount++;
  env.statistics->generatedClauses++;

  cl=doImmediateSimplification(cl);
  if (!cl) {
    return;
  }
  if (cl->isEmpty()) {
    handleEmptyClause(cl);
    return;
  }

  cl->setStore(Clause::UNPROCESSED);
  _unprocessed->add(cl);
}